

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::doc(Tree *this,size_t i)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  Tree *this_00;
  NodeData *pNVar3;
  size_t sVar4;
  undefined8 in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  Tree *in_stack_00000028;
  size_t rid;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  Location *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffc8;
  Tree *in_stack_ffffffffffffffd0;
  undefined8 uVar5;
  Tree *pTVar6;
  
  uVar5 = in_RDI;
  this_00 = (Tree *)root_id(in_stack_ffffffffffffffd0);
  pTVar6 = this_00;
  pNVar3 = _p(this_00,in_stack_ffffffffffffffc8);
  if (((pNVar3->m_type).type & STREAM) != STREAM) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                       ,in_stack_ffffffffffffff78);
    loc.super_LineCol.line = (size_t)pTVar6;
    loc.super_LineCol.offset = uVar5;
    loc.super_LineCol.col = in_RDI;
    loc.name.str = (char *)pNVar3;
    loc.name.len = unaff_retaddr;
    error<29ul>((char (*) [29])this_00,loc);
  }
  sVar4 = child(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  return sVar4;
}

Assistant:

size_t doc(size_t i) const { size_t rid = root_id(); RYML_ASSERT(is_stream(rid)); return child(rid, i); }